

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

size_t EncodeTree(uint *ll_lengths,uint *d_lengths,int use_16,int use_17,int use_18,uchar *bp,
                 uchar **out,size_t *outsize)

{
  byte bVar1;
  long lVar2;
  uint *puVar3;
  void *__ptr;
  void *__ptr_00;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint *puVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  uint symbol;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  size_t local_178 [20];
  uint clcl [19];
  uint clsymbols [19];
  
  for (lVar2 = 0; lVar2 != 0x13; lVar2 = lVar2 + 1) {
    local_178[lVar2] = 0;
  }
  uVar4 = 0;
  for (lVar2 = 0; lVar2 != -0x1d; lVar2 = lVar2 + -1) {
    if (ll_lengths[lVar2 + 0x11d] != 0) {
      uVar4 = (int)lVar2 + 0x1d;
      break;
    }
  }
  lVar2 = -0x11f;
  symbol = 0x1d;
  while ((symbol != 0 && (d_lengths[symbol] == 0))) {
    lVar2 = lVar2 + 1;
    symbol = symbol - 1;
  }
  uVar14 = (ulong)(uVar4 + 0x101);
  uVar15 = (ulong)uVar4 - lVar2;
  uVar11 = 0;
  uVar18 = 0;
  __ptr_00 = (void *)0x0;
  __ptr = (void *)0x0;
  for (uVar13 = 0; uVar13 < uVar15; uVar13 = uVar13 + (uVar16 - 1) + 1) {
    puVar3 = d_lengths + (uVar13 - uVar14);
    if (uVar13 < uVar14) {
      puVar3 = ll_lengths + uVar13;
    }
    bVar1 = (byte)*puVar3;
    uVar7 = (uint)bVar1;
    uVar16 = (uint)bVar1;
    if (use_16 == 0) {
      if (use_18 == 0 && use_17 == 0) {
        uVar17 = 1;
      }
      else {
        uVar17 = 1;
        uVar16 = 0;
        if (bVar1 == 0) goto LAB_00103f49;
      }
    }
    else {
LAB_00103f49:
      uVar7 = uVar16;
      puVar3 = ll_lengths + uVar13 + 1;
      puVar8 = d_lengths + ((uVar13 - 0x100) - (ulong)uVar4);
      for (uVar17 = 1; uVar13 + uVar17 < uVar15; uVar17 = uVar17 + 1) {
        puVar12 = puVar8;
        if (uVar13 + uVar17 < uVar14) {
          puVar12 = puVar3;
        }
        if (uVar7 != *puVar12) break;
        puVar3 = puVar3 + 1;
        puVar8 = puVar8 + 1;
      }
    }
    uVar16 = (uint)uVar17;
    if (uVar16 < 3 || uVar7 != 0) {
      uVar17 = uVar17 & 0xffffffff;
LAB_00104092:
      if ((use_16 != 0) && (3 < (uint)uVar17)) {
        local_178[uVar7] = local_178[uVar7] + 1;
        if (out != (uchar **)0x0) {
          if ((uVar18 & uVar18 - 1) == 0) {
            if (uVar18 == 0) {
              __ptr = malloc(4);
            }
            else {
              __ptr = realloc(__ptr,uVar18 * 8);
            }
          }
          *(uint *)((long)__ptr + uVar18 * 4) = uVar7;
          if ((uVar11 & uVar11 - 1) == 0) {
            if (uVar11 == 0) {
              __ptr_00 = malloc(4);
            }
            else {
              __ptr_00 = realloc(__ptr_00,uVar11 * 8);
            }
          }
          uVar18 = uVar18 + 1;
          *(undefined4 *)((long)__ptr_00 + uVar11 * 4) = 0;
          uVar11 = uVar11 + 1;
        }
        sVar9 = local_178[0x10];
        for (uVar20 = (uint)uVar17 - 1; uVar17 = (ulong)uVar20, 2 < uVar20; uVar20 = uVar20 - uVar19
            ) {
          uVar19 = 6;
          if (uVar20 < 6) {
            uVar19 = uVar20;
          }
          if (out != (uchar **)0x0) {
            if ((uVar18 & uVar18 - 1) == 0) {
              if (uVar18 == 0) {
                __ptr = malloc(4);
              }
              else {
                __ptr = realloc(__ptr,uVar18 * 8);
              }
            }
            *(undefined4 *)((long)__ptr + uVar18 * 4) = 0x10;
            if ((uVar11 & uVar11 - 1) == 0) {
              if (uVar11 == 0) {
                __ptr_00 = malloc(4);
              }
              else {
                __ptr_00 = realloc(__ptr_00,uVar11 * 8);
              }
            }
            uVar18 = uVar18 + 1;
            *(uint *)((long)__ptr_00 + uVar11 * 4) = uVar19 - 3;
            uVar11 = uVar11 + 1;
          }
          sVar9 = sVar9 + 1;
        }
        local_178[0x10] = sVar9;
      }
    }
    else {
      if (uVar16 < 0xb || use_18 == 0) {
        uVar17 = uVar17 & 0xffffffff;
      }
      else {
        uVar17 = uVar17 & 0xffffffff;
        sVar9 = local_178[0x12];
        do {
          uVar19 = (uint)uVar17;
          uVar20 = 0x8a;
          if (uVar19 < 0x8a) {
            uVar20 = uVar19;
          }
          if (out != (uchar **)0x0) {
            if ((uVar18 & uVar18 - 1) == 0) {
              if (uVar18 == 0) {
                __ptr = malloc(4);
              }
              else {
                __ptr = realloc(__ptr,uVar18 * 8);
              }
            }
            *(undefined4 *)((long)__ptr + uVar18 * 4) = 0x12;
            if ((uVar11 & uVar11 - 1) == 0) {
              if (uVar11 == 0) {
                __ptr_00 = malloc(4);
              }
              else {
                __ptr_00 = realloc(__ptr_00,uVar11 * 8);
              }
            }
            uVar18 = uVar18 + 1;
            *(uint *)((long)__ptr_00 + uVar11 * 4) = uVar20 - 0xb;
            uVar11 = uVar11 + 1;
          }
          sVar9 = sVar9 + 1;
          uVar17 = (ulong)(uVar19 - uVar20);
        } while (10 < uVar19 - uVar20);
        local_178[0x12] = sVar9;
      }
      if ((use_17 == 0) || (sVar9 = local_178[0x11], (uint)uVar17 < 3)) goto LAB_00104092;
      do {
        uVar19 = (uint)uVar17;
        uVar20 = 10;
        if (uVar19 < 10) {
          uVar20 = uVar19;
        }
        if (out != (uchar **)0x0) {
          if ((uVar18 & uVar18 - 1) == 0) {
            if (uVar18 == 0) {
              __ptr = malloc(4);
            }
            else {
              __ptr = realloc(__ptr,uVar18 * 8);
            }
          }
          *(undefined4 *)((long)__ptr + uVar18 * 4) = 0x11;
          if ((uVar11 & uVar11 - 1) == 0) {
            if (uVar11 == 0) {
              __ptr_00 = malloc(4);
            }
            else {
              __ptr_00 = realloc(__ptr_00,uVar11 * 8);
            }
          }
          uVar18 = uVar18 + 1;
          *(uint *)((long)__ptr_00 + uVar11 * 4) = uVar20 - 3;
          uVar11 = uVar11 + 1;
        }
        sVar9 = sVar9 + 1;
        uVar17 = (ulong)(uVar19 - uVar20);
      } while (2 < uVar19 - uVar20);
      local_178[0x11] = sVar9;
    }
    local_178[uVar7] = local_178[uVar7] + uVar17;
    while (iVar21 = (int)uVar17, uVar17 = (ulong)(iVar21 - 1), iVar21 != 0) {
      if (out != (uchar **)0x0) {
        if ((uVar18 & uVar18 - 1) == 0) {
          if (uVar18 == 0) {
            __ptr = malloc(4);
          }
          else {
            __ptr = realloc(__ptr,uVar18 * 8);
          }
        }
        *(uint *)((long)__ptr + uVar18 * 4) = uVar7;
        if ((uVar11 & uVar11 - 1) == 0) {
          if (uVar11 == 0) {
            __ptr_00 = malloc(4);
          }
          else {
            __ptr_00 = realloc(__ptr_00,uVar11 * 8);
          }
        }
        uVar18 = uVar18 + 1;
        *(undefined4 *)((long)__ptr_00 + uVar11 * 4) = 0;
        uVar11 = uVar11 + 1;
      }
    }
  }
  ZopfliCalculateBitLengths(local_178,0x13,7,clcl);
  if (out != (uchar **)0x0) {
    ZopfliLengthsToSymbols(clcl,0x13,7,clsymbols);
  }
  uVar11 = 0xf;
  do {
    uVar13 = uVar11;
    if (uVar13 == 0) {
      uVar13 = 0;
      break;
    }
    uVar11 = uVar13 - 1;
  } while (local_178[EncodeTree::order[uVar13 + 3]] == 0);
  if (out != (uchar **)0x0) {
    AddBits(uVar4,5,bp,out,outsize);
    AddBits(symbol,5,bp,out,outsize);
    AddBits((uint)uVar13,4,bp,out,outsize);
    for (lVar2 = 0; (uVar13 & 0xffffffff) * 4 + 0x10 != lVar2; lVar2 = lVar2 + 4) {
      AddBits(clcl[*(uint *)((long)EncodeTree::order + lVar2)],3,bp,out,outsize);
    }
    for (uVar11 = 0; uVar18 != uVar11; uVar11 = uVar11 + 1) {
      uVar4 = *(uint *)((long)__ptr + uVar11 * 4);
      AddHuffmanBits(clsymbols[uVar4],clcl[uVar4],bp,out,outsize);
      uVar4 = *(int *)((long)__ptr + uVar11 * 4) - 0x10;
      if (uVar4 < 3) {
        AddBits(*(uint *)((long)__ptr_00 + uVar11 * 4),*(uint *)(&DAT_0010919c + (ulong)uVar4 * 4),
                bp,out,outsize);
      }
    }
  }
  lVar2 = (ulong)((uint)uVar13 * 3 + 0xc) + 0xe;
  for (lVar5 = 0; lVar5 != 0x13; lVar5 = lVar5 + 1) {
    lVar2 = lVar2 + (ulong)clcl[lVar5] * local_178[lVar5];
  }
  lVar5 = local_178[0x10] * 2;
  lVar6 = local_178[0x11] * 3;
  lVar10 = local_178[0x12] * 7;
  free(__ptr);
  free(__ptr_00);
  return lVar10 + lVar6 + lVar2 + lVar5;
}

Assistant:

static size_t EncodeTree(const unsigned* ll_lengths,
                         const unsigned* d_lengths,
                         int use_16, int use_17, int use_18,
                         unsigned char* bp,
                         unsigned char** out, size_t* outsize) {
  unsigned lld_total;  /* Total amount of literal, length, distance codes. */
  /* Runlength encoded version of lengths of litlen and dist trees. */
  unsigned* rle = 0;
  unsigned* rle_bits = 0;  /* Extra bits for rle values 16, 17 and 18. */
  size_t rle_size = 0;  /* Size of rle array. */
  size_t rle_bits_size = 0;  /* Should have same value as rle_size. */
  unsigned hlit = 29;  /* 286 - 257 */
  unsigned hdist = 29;  /* 32 - 1, but gzip does not like hdist > 29.*/
  unsigned hclen;
  unsigned hlit2;
  size_t i, j;
  size_t clcounts[19];
  unsigned clcl[19];  /* Code length code lengths. */
  unsigned clsymbols[19];
  /* The order in which code length code lengths are encoded as per deflate. */
  static const unsigned order[19] = {
    16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15
  };
  int size_only = !out;
  size_t result_size = 0;

  for(i = 0; i < 19; i++) clcounts[i] = 0;

  /* Trim zeros. */
  while (hlit > 0 && ll_lengths[257 + hlit - 1] == 0) hlit--;
  while (hdist > 0 && d_lengths[1 + hdist - 1] == 0) hdist--;
  hlit2 = hlit + 257;

  lld_total = hlit2 + hdist + 1;

  for (i = 0; i < lld_total; i++) {
    /* This is an encoding of a huffman tree, so now the length is a symbol */
    unsigned char symbol = i < hlit2 ? ll_lengths[i] : d_lengths[i - hlit2];
    unsigned count = 1;
    if(use_16 || (symbol == 0 && (use_17 || use_18))) {
      for (j = i + 1; j < lld_total && symbol ==
          (j < hlit2 ? ll_lengths[j] : d_lengths[j - hlit2]); j++) {
        count++;
      }
    }
    i += count - 1;

    /* Repetitions of zeroes */
    if (symbol == 0 && count >= 3) {
      if (use_18) {
        while (count >= 11) {
          unsigned count2 = count > 138 ? 138 : count;
          if (!size_only) {
            ZOPFLI_APPEND_DATA(18, &rle, &rle_size);
            ZOPFLI_APPEND_DATA(count2 - 11, &rle_bits, &rle_bits_size);
          }
          clcounts[18]++;
          count -= count2;
        }
      }
      if (use_17) {
        while (count >= 3) {
          unsigned count2 = count > 10 ? 10 : count;
          if (!size_only) {
            ZOPFLI_APPEND_DATA(17, &rle, &rle_size);
            ZOPFLI_APPEND_DATA(count2 - 3, &rle_bits, &rle_bits_size);
          }
          clcounts[17]++;
          count -= count2;
        }
      }
    }

    /* Repetitions of any symbol */
    if (use_16 && count >= 4) {
      count--;  /* Since the first one is hardcoded. */
      clcounts[symbol]++;
      if (!size_only) {
        ZOPFLI_APPEND_DATA(symbol, &rle, &rle_size);
        ZOPFLI_APPEND_DATA(0, &rle_bits, &rle_bits_size);
      }
      while (count >= 3) {
        unsigned count2 = count > 6 ? 6 : count;
        if (!size_only) {
          ZOPFLI_APPEND_DATA(16, &rle, &rle_size);
          ZOPFLI_APPEND_DATA(count2 - 3, &rle_bits, &rle_bits_size);
        }
        clcounts[16]++;
        count -= count2;
      }
    }

    /* No or insufficient repetition */
    clcounts[symbol] += count;
    while (count > 0) {
      if (!size_only) {
        ZOPFLI_APPEND_DATA(symbol, &rle, &rle_size);
        ZOPFLI_APPEND_DATA(0, &rle_bits, &rle_bits_size);
      }
      count--;
    }
  }

  ZopfliCalculateBitLengths(clcounts, 19, 7, clcl);
  if (!size_only) ZopfliLengthsToSymbols(clcl, 19, 7, clsymbols);

  hclen = 15;
  /* Trim zeros. */
  while (hclen > 0 && clcounts[order[hclen + 4 - 1]] == 0) hclen--;

  if (!size_only) {
    AddBits(hlit, 5, bp, out, outsize);
    AddBits(hdist, 5, bp, out, outsize);
    AddBits(hclen, 4, bp, out, outsize);

    for (i = 0; i < hclen + 4; i++) {
      AddBits(clcl[order[i]], 3, bp, out, outsize);
    }

    for (i = 0; i < rle_size; i++) {
      unsigned symbol = clsymbols[rle[i]];
      AddHuffmanBits(symbol, clcl[rle[i]], bp, out, outsize);
      /* Extra bits. */
      if (rle[i] == 16) AddBits(rle_bits[i], 2, bp, out, outsize);
      else if (rle[i] == 17) AddBits(rle_bits[i], 3, bp, out, outsize);
      else if (rle[i] == 18) AddBits(rle_bits[i], 7, bp, out, outsize);
    }
  }

  result_size += 14;  /* hlit, hdist, hclen bits */
  result_size += (hclen + 4) * 3;  /* clcl bits */
  for(i = 0; i < 19; i++) {
    result_size += clcl[i] * clcounts[i];
  }
  /* Extra bits. */
  result_size += clcounts[16] * 2;
  result_size += clcounts[17] * 3;
  result_size += clcounts[18] * 7;

  /* Note: in case of "size_only" these are null pointers so no effect. */
  free(rle);
  free(rle_bits);

  return result_size;
}